

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O3

bool __thiscall
re2::Regexp::ParseState::ParseCharClass
          (ParseState *this,StringPiece *s,Regexp **out_re,RegexpStatus *status)

{
  char *pcVar1;
  char cVar2;
  char cVar3;
  byte bVar4;
  bool bVar5;
  ParseStatus PVar6;
  Regexp *this_00;
  CharClassBuilder *pCVar7;
  UGroup *g;
  uint uVar8;
  ParseFlags parse_flags;
  int iVar9;
  char *pcVar10;
  bool bVar11;
  RuneRange rr;
  StringPiece whole_class;
  Rune r;
  StringPiece local_68;
  ParseFlags local_50;
  int local_4c;
  StringPiece local_48;
  Rune local_34;
  
  local_48.ptr_ = s->ptr_;
  local_48.length_ = s->length_;
  local_48._12_4_ = *(undefined4 *)&s->field_0xc;
  if ((s->length_ == 0) || (*s->ptr_ != '[')) {
    status->code_ = kRegexpInternalError;
    (status->error_arg_).ptr_ = (char *)0x0;
    (status->error_arg_).length_ = 0;
LAB_001136a6:
    bVar11 = false;
  }
  else {
    this_00 = (Regexp *)operator_new(0x28);
    Regexp(this_00,kRegexpCharClass,this->flags_ & ~FoldCase);
    pCVar7 = (CharClassBuilder *)operator_new(0x40);
    CharClassBuilder::CharClassBuilder(pCVar7);
    (this_00->field_7).field_3.ccb_ = pCVar7;
    pcVar10 = s->ptr_;
    pcVar1 = pcVar10 + 1;
    s->ptr_ = pcVar1;
    iVar9 = s->length_;
    uVar8 = iVar9 - 1;
    s->length_ = uVar8;
    if (iVar9 < 2) {
      if (uVar8 == 0) goto LAB_00113706;
      s->ptr_ = s->ptr_ + 1;
      s->length_ = iVar9 + -2;
    }
    else {
      cVar2 = *pcVar1;
      bVar11 = cVar2 == '^';
      if (bVar11) {
        s->ptr_ = pcVar10 + 2;
        uVar8 = iVar9 - 2;
        s->length_ = uVar8;
        if ((this->flags_ & (NeverNL|ClassNL)) != ClassNL) {
          CharClassBuilder::AddRange(pCVar7,10,10);
          uVar8 = s->length_;
        }
        if (0 < (int)uVar8) goto LAB_001134d5;
        bVar11 = true;
      }
      else {
LAB_001134d5:
        local_4c = 0x1c;
        bVar4 = 1;
        do {
          pcVar1 = s->ptr_;
          cVar3 = *pcVar1;
          if ((bool)(~bVar4 & cVar3 == ']')) {
            s->ptr_ = pcVar1 + 1;
            s->length_ = uVar8 - 1;
            if (cVar2 != '^') goto LAB_001136e3;
            goto LAB_001136da;
          }
          if ((bool)(bVar4 | cVar3 != '-')) {
            if (cVar3 == '[' && 2 < uVar8) {
              if ((pcVar1[1] != ':') || (uVar8 < 4)) goto LAB_001135cb;
              pCVar7 = (this_00->field_7).field_3.ccb_;
              pcVar10 = pcVar1 + 2;
              iVar9 = 4;
              do {
                if ((*pcVar10 == ':') && (pcVar10[1] == ']')) {
                  local_68.length_ = iVar9;
                  local_68.ptr_ = pcVar1;
                  local_50 = this->flags_;
                  g = LookupGroup(&local_68,(UGroup *)posix_groups,local_4c);
                  if (g == (UGroup *)0x0) {
                    status->code_ = kRegexpBadCharRange;
                    (status->error_arg_).ptr_ = local_68.ptr_;
                    iVar9 = local_68.length_;
                    goto LAB_0011371a;
                  }
                  s->ptr_ = s->ptr_ + local_68.length_;
                  s->length_ = s->length_ - local_68.length_;
                  iVar9 = g->sign;
                  parse_flags = local_50;
                  goto LAB_001135ea;
                }
                pcVar10 = pcVar10 + 1;
                iVar9 = iVar9 + 1;
              } while (pcVar10 <= pcVar1 + uVar8 + -2);
            }
            if ((cVar3 != '\\' || (int)uVar8 < 3) || ((byte)(pcVar1[1] | 0x20U) != 0x70))
            goto LAB_001135cb;
            PVar6 = ParseUnicodeGroup(s,this->flags_,(this_00->field_7).field_3.ccb_,status);
            if (PVar6 != kParseOk) {
              if (PVar6 != kParseError) goto LAB_001135cb;
              goto LAB_0011371e;
            }
          }
          else {
            if (((this->flags_ & PerlX) == NoParseFlags) && ((uVar8 == 1 || (pcVar1[1] != ']')))) {
              local_68.ptr_ = s->ptr_ + 1;
              local_68.length_ = (int)*(undefined8 *)&s->length_;
              local_68._12_4_ = SUB84((ulong)*(undefined8 *)&s->length_ >> 0x20,0);
              local_68.length_ = local_68.length_ + -1;
              iVar9 = StringPieceToRune(&local_34,&local_68,status);
              if (iVar9 < 0) goto LAB_0011371e;
              status->code_ = kRegexpBadCharRange;
              iVar9 = iVar9 + 1;
              (status->error_arg_).ptr_ = s->ptr_;
              goto LAB_0011371a;
            }
LAB_001135cb:
            g = MaybeParsePerlCCEscape(s,this->flags_);
            if (g == (UGroup *)0x0) {
              local_68.ptr_ = (char *)0x0;
              bVar5 = ParseCCRange(this,s,(RuneRange *)&local_68,&local_48,status);
              if (!bVar5) goto LAB_0011371e;
              CharClassBuilder::AddRangeFlags
                        ((this_00->field_7).field_3.ccb_,(Rune)local_68.ptr_,local_68.ptr_._4_4_,
                         this->flags_ | ClassNL);
            }
            else {
              pCVar7 = (this_00->field_7).field_3.ccb_;
              iVar9 = g->sign;
              parse_flags = this->flags_;
LAB_001135ea:
              AddUGroup(pCVar7,g,iVar9,parse_flags);
            }
          }
          uVar8 = s->length_;
          bVar4 = 0;
        } while (0 < (int)uVar8);
      }
      if (uVar8 == 0) {
LAB_00113706:
        status->code_ = kRegexpMissingBracket;
        (status->error_arg_).ptr_ = local_48.ptr_;
        iVar9 = local_48.length_;
LAB_0011371a:
        (status->error_arg_).length_ = iVar9;
LAB_0011371e:
        Decref(this_00);
        goto LAB_001136a6;
      }
      s->ptr_ = s->ptr_ + 1;
      s->length_ = uVar8 - 1;
      if (bVar11) {
LAB_001136da:
        CharClassBuilder::Negate((this_00->field_7).field_3.ccb_);
      }
    }
LAB_001136e3:
    *out_re = this_00;
    bVar11 = true;
  }
  return bVar11;
}

Assistant:

bool Regexp::ParseState::ParseCharClass(StringPiece* s,
                                        Regexp** out_re,
                                        RegexpStatus* status) {
  StringPiece whole_class = *s;
  if (s->size() == 0 || (*s)[0] != '[') {
    // Caller checked this.
    status->set_code(kRegexpInternalError);
    status->set_error_arg(NULL);
    return false;
  }
  bool negated = false;
  Regexp* re = new Regexp(kRegexpCharClass, flags_ & ~FoldCase);
  re->ccb_ = new CharClassBuilder;
  s->remove_prefix(1);  // '['
  if (s->size() > 0 && (*s)[0] == '^') {
    s->remove_prefix(1);  // '^'
    negated = true;
    if (!(flags_ & ClassNL) || (flags_ & NeverNL)) {
      // If NL can't match implicitly, then pretend
      // negated classes include a leading \n.
      re->ccb_->AddRange('\n', '\n');
    }
  }
  bool first = true;  // ] is okay as first char in class
  while (s->size() > 0 && ((*s)[0] != ']' || first)) {
    // - is only okay unescaped as first or last in class.
    // Except that Perl allows - anywhere.
    if ((*s)[0] == '-' && !first && !(flags_&PerlX) &&
        (s->size() == 1 || (*s)[1] != ']')) {
      StringPiece t = *s;
      t.remove_prefix(1);  // '-'
      Rune r;
      int n = StringPieceToRune(&r, &t, status);
      if (n < 0) {
        re->Decref();
        return false;
      }
      status->set_code(kRegexpBadCharRange);
      status->set_error_arg(StringPiece(s->data(), 1+n));
      re->Decref();
      return false;
    }
    first = false;

    // Look for [:alnum:] etc.
    if (s->size() > 2 && (*s)[0] == '[' && (*s)[1] == ':') {
      switch (ParseCCName(s, flags_, re->ccb_, status)) {
        case kParseOk:
          continue;
        case kParseError:
          re->Decref();
          return false;
        case kParseNothing:
          break;
      }
    }

    // Look for Unicode character group like \p{Han}
    if (s->size() > 2 &&
        (*s)[0] == '\\' &&
        ((*s)[1] == 'p' || (*s)[1] == 'P')) {
      switch (ParseUnicodeGroup(s, flags_, re->ccb_, status)) {
        case kParseOk:
          continue;
        case kParseError:
          re->Decref();
          return false;
        case kParseNothing:
          break;
      }
    }

    // Look for Perl character class symbols (extension).
    const UGroup *g = MaybeParsePerlCCEscape(s, flags_);
    if (g != NULL) {
      AddUGroup(re->ccb_, g, g->sign, flags_);
      continue;
    }

    // Otherwise assume single character or simple range.
    RuneRange rr;
    if (!ParseCCRange(s, &rr, whole_class, status)) {
      re->Decref();
      return false;
    }
    // AddRangeFlags is usually called in response to a class like
    // \p{Foo} or [[:foo:]]; for those, it filters \n out unless
    // Regexp::ClassNL is set.  In an explicit range or singleton
    // like we just parsed, we do not filter \n out, so set ClassNL
    // in the flags.
    re->ccb_->AddRangeFlags(rr.lo, rr.hi, flags_ | Regexp::ClassNL);
  }
  if (s->size() == 0) {
    status->set_code(kRegexpMissingBracket);
    status->set_error_arg(whole_class);
    re->Decref();
    return false;
  }
  s->remove_prefix(1);  // ']'

  if (negated)
    re->ccb_->Negate();

  *out_re = re;
  return true;
}